

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_sync.h
# Opt level: O3

void __thiscall PacketSync::PacketSync(PacketSync *this)

{
  void *pvVar1;
  uv_buf_t uVar2;
  
  this->_vptr_PacketSync = (_func_int **)&PTR__PacketSync_0014dac8;
  pvVar1 = malloc(0x2800);
  this->packet_cb_ = (GetFullPacket)0x0;
  this->packetcb_userdata_ = (void *)0x0;
  uVar2 = (uv_buf_t)uv_buf_init(pvVar1,0x2800);
  this->thread_readdata = uVar2;
  pvVar1 = malloc(0x2800);
  uVar2 = (uv_buf_t)uv_buf_init(pvVar1,0x2800);
  this->thread_packetdata = uVar2;
  this->truepacketlen = 0;
  this->headpos = -1;
  this->headpt = (char *)0x0;
  this->parsetype = 1;
  this->getdatalen = 0;
  return;
}

Assistant:

PacketSync(): packet_cb_(NULL), packetcb_userdata_(NULL) {
        thread_readdata = uv_buf_init((char*)malloc(BUFFER_SIZE), BUFFER_SIZE); //负责从circulebuffer_读取数据
        thread_packetdata = uv_buf_init((char*)malloc(BUFFER_SIZE), BUFFER_SIZE); //负责从circulebuffer_读取packet 中data部分
        truepacketlen = 0;//readdata有效数据长度
        headpos = -1;//找到头位置
        headpt = NULL;//找到头位置
        parsetype = PARSE_NOTHING;
        getdatalen = 0;
    }